

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O3

void mbedtls_pem_free(mbedtls_pem_context *ctx)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  uchar *__ptr;
  
  __ptr = ctx->buf;
  if (__ptr == (uchar *)0x0) {
    __ptr = (uchar *)0x0;
  }
  else {
    sVar1 = ctx->buflen;
    if (sVar1 != 0) {
      sVar3 = 0;
      do {
        __ptr[sVar3] = '\0';
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
      __ptr = ctx->buf;
    }
  }
  free(__ptr);
  free(ctx->info);
  lVar2 = 0;
  do {
    *(undefined1 *)((long)&ctx->buf + lVar2) = 0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x18);
  return;
}

Assistant:

void mbedtls_pem_free( mbedtls_pem_context *ctx )
{
    if( ctx->buf != NULL )
        mbedtls_zeroize( ctx->buf, ctx->buflen );
    mbedtls_free( ctx->buf );
    mbedtls_free( ctx->info );

    mbedtls_zeroize( ctx, sizeof( mbedtls_pem_context ) );
}